

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encapsulation.cpp
# Opt level: O1

void __thiscall
Encapsulation_hierarchyRepeatedComponent_Test::~Encapsulation_hierarchyRepeatedComponent_Test
          (Encapsulation_hierarchyRepeatedComponent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Encapsulation, hierarchyRepeatedComponent)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"main\">\n"
        "  <component name=\"repeated_component\"/>\n"
        "  <component name=\"repeated_component\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"repeated_component\">\n"
        "      <component_ref component=\"repeated_component\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Model 'main' contains multiple components with the name 'repeated_component'. Valid component names must be unique to their model.",
    };

    libcellml::ModelPtr model = libcellml::Model::create();
    model->setName("main");
    libcellml::ComponentPtr first_instance = libcellml::Component::create();
    first_instance->setName("repeated_component");
    libcellml::ComponentPtr second_instance = libcellml::Component::create();
    second_instance->setName("repeated_component");

    model->addComponent(first_instance);
    first_instance->addComponent(second_instance);

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string actual = printer->printModel(model);
    EXPECT_EQ(e, actual);

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    v->validateModel(model);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}